

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cpp
# Opt level: O2

Module * mocker::buildIR(Module *__return_storage_ptr__,shared_ptr<mocker::ast::ASTRoot> *ast,
                        SemanticContext *semanticCtx)

{
  element_type *peVar1;
  Module *pMVar2;
  BBLIter BVar3;
  shared_ptr<mocker::ast::ASTRoot> *ast_00;
  BasicBlock *pBVar4;
  unordered_map<unsigned_long,_std::shared_ptr<mocker::ast::Type>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Type>_>_>_>
  *exprType;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  undefined1 local_58c [4];
  shared_ptr<mocker::ir::Reg> funcRes;
  undefined1 local_578 [40];
  shared_ptr<mocker::ir::Reg> tmp;
  shared_ptr<mocker::ir::Reg> ptr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_528;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_510;
  shared_ptr<mocker::ir::IRInst> local_4f8;
  shared_ptr<mocker::ir::IRInst> local_4e8;
  shared_ptr<mocker::ir::IRInst> local_4d8;
  shared_ptr<mocker::ir::IRInst> local_4c8;
  shared_ptr<mocker::ir::IRInst> local_4b8;
  shared_ptr<mocker::ir::IRInst> local_4a8;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  FunctionModule func;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  redundantNode;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pureFuncs;
  BuilderContext IRCtx;
  
  exprType = &semanticCtx->exprType;
  renameASTIdentifiers(ast,&semanticCtx->scopeResiding,&semanticCtx->associatedDecl,exprType);
  findPureFunctions_abi_cxx11_(&pureFuncs,(mocker *)ast,ast_00);
  std::__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<mocker::ast::ASTRoot,void>
            ((__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2> *)&IRCtx,
             &ast->super___shared_ptr<mocker::ast::ASTRoot,_(__gnu_cxx::_Lock_policy)2>);
  findRedundantNodes(&redundantNode,(shared_ptr<mocker::ast::ASTNode> *)&IRCtx,exprType,&pureFuncs);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&IRCtx.logicalExprInfo.trueNext);
  ir::BuilderContext::BuilderContext(&IRCtx,exprType,&redundantNode);
  peVar1 = (ast->super___shared_ptr<mocker::ast::ASTRoot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  func.identifier._M_dataplus._M_p = (pointer)&PTR_operator___001f10d8;
  func.identifier._M_string_length = (size_type)&IRCtx;
  (*(peVar1->super_ASTNode)._vptr_ASTNode[3])(peVar1,&func);
  pMVar2 = ir::BuilderContext::getResult(&IRCtx);
  ir::Module::Module(__return_storage_ptr__,pMVar2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_430,"#_array_#size",(allocator<char> *)&ptr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_578,"ptr",(allocator<char> *)&tmp);
  __l._M_len = 1;
  __l._M_array = (iterator)local_578;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_510,__l,(allocator_type *)&funcRes);
  ir::FunctionModule::FunctionModule(&func,&local_430,&local_510,false);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_510);
  std::__cxx11::string::~string((string *)local_578);
  std::__cxx11::string::~string((string *)&local_430);
  BVar3 = ir::FunctionModule::pushBackBB(&func);
  std::make_shared<mocker::ir::Reg,char_const(&)[2]>((char (*) [2])&ptr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_578,"",(allocator<char> *)&funcRes);
  ir::FunctionModule::makeTempLocalReg((FunctionModule *)&tmp,&func.identifier);
  std::__cxx11::string::~string((string *)local_578);
  local_58c = (undefined1  [4])0x6;
  std::make_shared<mocker::ir::IntLiteral,int>((int *)&funcRes);
  std::
  make_shared<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::ArithBinaryInst::OpType,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::IntLiteral>>
            ((shared_ptr<mocker::ir::Reg> *)local_578,(OpType *)&tmp,
             (shared_ptr<mocker::ir::Reg> *)local_58c,(shared_ptr<mocker::ir::IntLiteral> *)&ptr);
  pBVar4 = (BasicBlock *)(BVar3._M_node + 1);
  local_4a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_578._0_8_;
  local_4a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_578._8_8_;
  local_578._0_8_ = (pointer)0x0;
  local_578._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ir::BasicBlock::appendInst(pBVar4,&local_4a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_4a8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_578 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&funcRes.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_578,"",(allocator<char> *)local_58c);
  ir::FunctionModule::makeTempLocalReg((FunctionModule *)&funcRes,&func.identifier);
  std::__cxx11::string::~string((string *)local_578);
  std::
  make_shared<mocker::ir::Load,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>&>
            ((shared_ptr<mocker::ir::Reg> *)local_578,&funcRes);
  local_4b8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_578._0_8_;
  local_4b8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_578._8_8_;
  local_578._0_8_ = (pointer)0x0;
  local_578._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ir::BasicBlock::appendInst(pBVar4,&local_4b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_4b8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_578 + 8));
  std::make_shared<mocker::ir::Ret,std::shared_ptr<mocker::ir::Reg>&>
            ((shared_ptr<mocker::ir::Reg> *)local_578);
  local_4c8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_578._0_8_;
  local_4c8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_578._8_8_;
  local_578._0_8_ = (pointer)0x0;
  local_578._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ir::BasicBlock::appendInst(pBVar4,&local_4c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_4c8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_578 + 8));
  std::__cxx11::string::string((string *)&local_450,(string *)&func);
  ir::Module::overwriteFunc(__return_storage_ptr__,&local_450,&func);
  std::__cxx11::string::~string((string *)&local_450);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&funcRes.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tmp.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ptr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ir::FunctionModule::~FunctionModule(&func);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_470,"#string#length",(allocator<char> *)&ptr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_578,"ptr",(allocator<char> *)&tmp);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_578;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_528,__l_00,(allocator_type *)&funcRes);
  ir::FunctionModule::FunctionModule(&func,&local_470,&local_528,false);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_528);
  std::__cxx11::string::~string((string *)local_578);
  std::__cxx11::string::~string((string *)&local_470);
  BVar3 = ir::FunctionModule::pushBackBB(&func);
  std::make_shared<mocker::ir::Reg,char_const(&)[2]>((char (*) [2])&ptr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_578,"",(allocator<char> *)&funcRes);
  ir::FunctionModule::makeTempLocalReg((FunctionModule *)&tmp,&func.identifier);
  std::__cxx11::string::~string((string *)local_578);
  local_58c = (undefined1  [4])0x6;
  std::make_shared<mocker::ir::IntLiteral,int>((int *)&funcRes);
  std::
  make_shared<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::Reg>&,mocker::ir::ArithBinaryInst::OpType,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::IntLiteral>>
            ((shared_ptr<mocker::ir::Reg> *)local_578,(OpType *)&tmp,
             (shared_ptr<mocker::ir::Reg> *)local_58c,(shared_ptr<mocker::ir::IntLiteral> *)&ptr);
  pBVar4 = (BasicBlock *)(BVar3._M_node + 1);
  local_4d8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_578._0_8_;
  local_4d8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_578._8_8_;
  local_578._0_8_ = (pointer)0x0;
  local_578._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ir::BasicBlock::appendInst(pBVar4,&local_4d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_4d8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_578 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&funcRes.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_578,"",(allocator<char> *)local_58c);
  ir::FunctionModule::makeTempLocalReg((FunctionModule *)&funcRes,&func.identifier);
  std::__cxx11::string::~string((string *)local_578);
  std::
  make_shared<mocker::ir::Load,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>&>
            ((shared_ptr<mocker::ir::Reg> *)local_578,&funcRes);
  local_4e8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_578._0_8_;
  local_4e8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_578._8_8_;
  local_578._0_8_ = (pointer)0x0;
  local_578._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ir::BasicBlock::appendInst(pBVar4,&local_4e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_4e8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_578 + 8));
  std::make_shared<mocker::ir::Ret,std::shared_ptr<mocker::ir::Reg>&>
            ((shared_ptr<mocker::ir::Reg> *)local_578);
  local_4f8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_578._0_8_;
  local_4f8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_578._8_8_;
  local_578._0_8_ = (pointer)0x0;
  local_578._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ir::BasicBlock::appendInst(pBVar4,&local_4f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_4f8.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_578 + 8));
  std::__cxx11::string::string((string *)&local_490,(string *)&func);
  ir::Module::overwriteFunc(__return_storage_ptr__,&local_490,&func);
  std::__cxx11::string::~string((string *)&local_490);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&funcRes.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&tmp.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ptr.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ir::FunctionModule::~FunctionModule(&func);
  ir::BuilderContext::~BuilderContext(&IRCtx);
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&redundantNode._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&pureFuncs._M_h);
  return __return_storage_ptr__;
}

Assistant:

ir::Module buildIR(const std::shared_ptr<ast::ASTRoot> &ast,
                   const SemanticContext &semanticCtx) {
  renameASTIdentifiers(ast, semanticCtx.scopeResiding,
                       semanticCtx.associatedDecl, semanticCtx.exprType);
  auto pureFuncs = findPureFunctions(ast);
  auto redundantNode = findRedundantNodes(ast, semanticCtx.exprType, pureFuncs);

  ir::BuilderContext IRCtx(semanticCtx.exprType, redundantNode);
  ast->accept(ir::Builder(IRCtx));
  auto res = IRCtx.getResult();

  // TODO: In current version, function inline must be enabled.
  // implement some simple builtin functions
  { // #_array_#size
    ir::FunctionModule func("#_array_#size", {"ptr"});
    auto bb = func.pushBackBB();
    auto ptr = std::make_shared<ir::Reg>("0");
    auto tmp = func.makeTempLocalReg();
    bb->appendInst(std::make_shared<ir::ArithBinaryInst>(
        tmp, ir::ArithBinaryInst::Sub, ptr,
        std::make_shared<ir::IntLiteral>(8)));
    auto funcRes = func.makeTempLocalReg();
    bb->appendInst(std::make_shared<ir::Load>(funcRes, tmp));
    bb->appendInst(std::make_shared<ir::Ret>(funcRes));
    res.overwriteFunc(func.getIdentifier(), func);
  }
  { // #string#length
    ir::FunctionModule func("#string#length", {"ptr"});
    auto bb = func.pushBackBB();
    auto ptr = std::make_shared<ir::Reg>("0");
    auto tmp = func.makeTempLocalReg();
    bb->appendInst(std::make_shared<ir::ArithBinaryInst>(
        tmp, ir::ArithBinaryInst::Sub, ptr,
        std::make_shared<ir::IntLiteral>(8)));
    auto funcRes = func.makeTempLocalReg();
    bb->appendInst(std::make_shared<ir::Load>(funcRes, tmp));
    bb->appendInst(std::make_shared<ir::Ret>(funcRes));
    res.overwriteFunc(func.getIdentifier(), func);
  }
  /*
  { // #string#ord ( this pos )
    ir::FunctionModule func("#string#ord", {"ptr", "pos"});
    auto bb = func.pushBackBB();
    auto ptr = std::make_shared<ir::Reg>("0");
    auto pos = std::make_shared<ir::Reg>("1");
    auto tmp = func.makeTempLocalReg();
    bb->appendInst(std::make_shared<ir::ArithBinaryInst>(
        tmp, ir::ArithBinaryInst::Add, ptr, pos));
    auto loadRes = func.makeTempLocalReg();
    bb->appendInst(std::make_shared<ir::Load>(loadRes, tmp));
    auto funcRes = func.makeTempLocalReg();
    bb->appendInst(std::make_shared<ir::ArithBinaryInst>(
        funcRes, ir::ArithBinaryInst::BitAnd, loadRes,
        std::make_shared<ir::IntLiteral>(255)));
    bb->appendInst(std::make_shared<ir::Ret>(funcRes));
    res.overwriteFunc(func.getIdentifier(), func);
  }
  */
  return res;
}